

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

int qMetaTypeId<QFlags<Qt::AlignmentFlag>>(void)

{
  int iVar1;
  long in_FS_OFFSET;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QFlags<Qt::AlignmentFlag>_>::metaType;
  iVar1 = QMetaType::registerHelper(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

inline constexpr int qMetaTypeId()
{
    if constexpr (bool(QMetaTypeId2<T>::IsBuiltIn)) {
        // this has the same result as the below code, but avoids asking the
        // compiler to load a global variable whose value we know at compile
        // time
        return QMetaTypeId2<T>::MetaType;
    } else {
        return QMetaType::fromType<T>().id();
    }
}